

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bheap.c
# Opt level: O1

int main(int argc,char **argv)

{
  code *pcVar1;
  uint32_t uVar2;
  time_t tVar3;
  sx_alloc *alloc;
  sx_bheap *bh;
  uint uVar4;
  char *pcVar5;
  int i;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  sx_bheap_item sVar10;
  sx_rng rng;
  sx_rng local_40;
  
  tVar3 = time((time_t *)0x0);
  sx_rng_seed(&local_40,(uint32_t)tVar3);
  alloc = sx_alloc_malloc();
  iVar7 = 0x20;
  bh = sx_bheap_create(alloc,0x20);
  puts("\nPushing values to _MIN_ binary heap:");
  do {
    uVar2 = sx_rng_gen(&local_40);
    uVar4 = uVar2 % 100 + 1;
    pcVar5 = "%d - ";
    if (iVar7 == 1) {
      pcVar5 = "%d\n";
    }
    printf(pcVar5,(ulong)uVar4);
    sx_bheap_push_min(bh,uVar4,(void *)0x0);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  puts("Pop: ");
  iVar7 = 0x20;
  do {
    sVar10 = sx_bheap_pop_min(bh);
    pcVar5 = "%d - ";
    if (iVar7 == 1) {
      pcVar5 = "%d\n";
    }
    printf(pcVar5,(ulong)(uint)sVar10.key,sVar10.user);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  puts("\nPushing values to _MAX_ binary heap:");
  iVar7 = 0x20;
  do {
    uVar2 = sx_rng_gen(&local_40);
    uVar4 = uVar2 % 100 + 1;
    pcVar5 = "%d - ";
    if (iVar7 == 1) {
      pcVar5 = "%d\n";
    }
    printf(pcVar5,(ulong)uVar4);
    sx_bheap_push_max(bh,uVar4,(void *)0x0);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  puts("Pop: ");
  iVar7 = 0x20;
  do {
    sVar10 = sx_bheap_pop_max(bh);
    pcVar5 = "%d - ";
    if (iVar7 == 1) {
      pcVar5 = "%d\n";
    }
    printf(pcVar5,(ulong)(uint)sVar10.key,sVar10.user);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  puts("\nPushing values to _MIN_ binary heap with Random pops during push:");
  iVar8 = 0;
  iVar7 = 0;
  do {
    uVar2 = sx_rng_gen(&local_40);
    uVar4 = uVar2 % 100 + 1;
    pcVar5 = "%d - ";
    if (iVar7 == 0x1f) {
      pcVar5 = "%d\n";
    }
    printf(pcVar5,(ulong)uVar4);
    sx_bheap_push_min(bh,uVar4,(void *)0x0);
    uVar2 = sx_rng_gen(&local_40);
    if (uVar2 % 100 < 0x31) {
      sVar10 = sx_bheap_pop_min(bh);
      if (0 < bh->count) {
        lVar6 = 0;
        lVar9 = 0;
        do {
          if (*(int *)((long)&bh->items->key + lVar6) < sVar10.key) {
            sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-bheap.c"
                              ,0x45,"key <= bh->items[k].key");
            pcVar1 = (code *)swi(3);
            iVar7 = (*pcVar1)();
            return iVar7;
          }
          lVar9 = lVar9 + 1;
          lVar6 = lVar6 + 0x10;
        } while (lVar9 < bh->count);
      }
      iVar8 = iVar8 + 1;
    }
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0x20);
  puts("Pop Remaining: ");
  if (iVar8 < 0x20) {
    iVar7 = 1;
    if (1 < 0x20 - iVar8) {
      iVar7 = 0x20 - iVar8;
    }
    do {
      sVar10 = sx_bheap_pop_min(bh);
      printf("%d - ",(ulong)(uint)sVar10.key,sVar10.user);
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  putchar(10);
  puts("\nPushing values to _MAX_ binary heap with Random pops during push:");
  iVar7 = 0;
  do {
    uVar2 = sx_rng_gen(&local_40);
    uVar4 = uVar2 % 100 + 1;
    pcVar5 = "%d - ";
    if (iVar7 == 0x1f) {
      pcVar5 = "%d\n";
    }
    printf(pcVar5,(ulong)uVar4);
    sx_bheap_push_max(bh,uVar4,(void *)0x0);
    uVar2 = sx_rng_gen(&local_40);
    if (uVar2 % 100 < 0x31) {
      sVar10 = sx_bheap_pop_max(bh);
      if (0 < bh->count) {
        lVar6 = 0;
        lVar9 = 0;
        do {
          if (sVar10.key < *(int *)((long)&bh->items->key + lVar6)) {
            sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/tests/test-bheap.c"
                              ,0x5d,"key >= bh->items[k].key");
            pcVar1 = (code *)swi(3);
            iVar7 = (*pcVar1)();
            return iVar7;
          }
          lVar9 = lVar9 + 1;
          lVar6 = lVar6 + 0x10;
        } while (lVar9 < bh->count);
      }
      iVar8 = iVar8 + 1;
    }
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0x20);
  puts("Pop Remaining: ");
  if (iVar8 < 0x20) {
    iVar7 = 1;
    if (1 < 0x20 - iVar8) {
      iVar7 = 0x20 - iVar8;
    }
    do {
      sVar10 = sx_bheap_pop_max(bh);
      printf("%d - ",(ulong)(uint)sVar10.key,sVar10.user);
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  putchar(10);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    static const int N = 32;

    sx_rng rng;
    sx_rng_seed(&rng, (uint32_t)time(NULL));

    const sx_alloc* alloc = sx_alloc_malloc();
    sx_bheap* bh = sx_bheap_create(alloc, N);

    puts("\nPushing values to _MIN_ binary heap:");
    for (int i = 0; i < N; i++) {
        int n = sx_rng_gen_rangei(&rng, 1, 100);
        if (i < N - 1)
            printf("%d - ", n);
        else
            printf("%d\n", n);
        sx_bheap_push_min(bh, n, 0);
    }

    puts("Pop: ");
    for (int i = 0; i < N; i++) {
        sx_bheap_item item = sx_bheap_pop_min(bh);
        if (i < N - 1)
            printf("%d - ", item.key);
        else
            printf("%d\n", item.key);
    }

    puts("\nPushing values to _MAX_ binary heap:");
    for (int i = 0; i < N; i++) {
        int n = sx_rng_gen_rangei(&rng, 1, 100);
        if (i < N - 1)
            printf("%d - ", n);
        else
            printf("%d\n", n);
        sx_bheap_push_max(bh, n, 0);
    }

    puts("Pop: ");
    for (int i = 0; i < N; i++) {
        sx_bheap_item item = sx_bheap_pop_max(bh);
        if (i < N - 1)
            printf("%d - ", item.key);
        else
            printf("%d\n", item.key);
    }

    puts("\nPushing values to _MIN_ binary heap with Random pops during push:");
    int num_pop = 0;

    for (int i = 0; i < N; i++) {
        int n = sx_rng_gen_rangei(&rng, 1, 100);
        if (i < N - 1)
            printf("%d - ", n);
        else
            printf("%d\n", n);
        sx_bheap_push_min(bh, n, 0);

        if (sx_rng_gen_rangei(&rng, 1, 100) < 50) {
            int key = sx_bheap_pop_min(bh).key;
            for (int k = 0; k < bh->count; k++) sx_assert(key <= bh->items[k].key);
            num_pop++;
        }
    }

    puts("Pop Remaining: ");
    for (int i = 0; i < N - num_pop; i++) {
        sx_bheap_item item = sx_bheap_pop_min(bh);
        printf("%d - ", item.key);
    }
    puts("");

    puts("\nPushing values to _MAX_ binary heap with Random pops during push:");

    for (int i = 0; i < N; i++) {
        int n = sx_rng_gen_rangei(&rng, 1, 100);
        if (i < N - 1)
            printf("%d - ", n);
        else
            printf("%d\n", n);
        sx_bheap_push_max(bh, n, 0);

        if (sx_rng_gen_rangei(&rng, 1, 100) < 50) {
            int key = sx_bheap_pop_max(bh).key;
            for (int k = 0; k < bh->count; k++) sx_assert(key >= bh->items[k].key);
            num_pop++;
        }
    }

    puts("Pop Remaining: ");
    for (int i = 0; i < N - num_pop; i++) {
        sx_bheap_item item = sx_bheap_pop_max(bh);
        printf("%d - ", item.key);
    }
    puts("");

    return 0;
}